

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O0

void verify_high_num_keeping_headers_param_test(void)

{
  fdb_status fVar1;
  char *pcVar2;
  fdb_status s_14;
  fdb_status s_13;
  fdb_status s_12;
  fdb_status s_11;
  fdb_status s_10;
  fdb_status s_9;
  fdb_status s_8;
  fdb_status s_7;
  fdb_status s_6;
  fdb_status s_5;
  fdb_status s_4;
  fdb_status s_3;
  fdb_status s_2;
  char *val;
  char *key;
  fdb_status s_1;
  fdb_status s;
  fdb_file_info file_info;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fdb_status status;
  fdb_kvs_handle *snap_db;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  size_t rvalue_len;
  void *rvalue;
  char keybuf [16];
  int nheaders;
  int low_seq;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_kvs_handle *in_stack_fffffffffffffc68;
  FILE *pFVar3;
  size_t *in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc94;
  size_t in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca4;
  fdb_kvs_handle *in_stack_fffffffffffffca8;
  fdb_kvs_config *in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe18;
  fdb_kvs_handle **in_stack_fffffffffffffe20;
  fdb_file_handle *in_stack_fffffffffffffe28;
  uint7 in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffe90;
  fdb_file_handle **in_stack_fffffffffffffe98;
  fdb_seqnum_t in_stack_ffffffffffffff10;
  fdb_kvs_handle **in_stack_ffffffffffffff18;
  fdb_kvs_handle *in_stack_ffffffffffffff20;
  char local_78 [24];
  int local_60;
  int local_5c;
  int local_58;
  uint local_54;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  memleak_start();
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  local_5c = 0;
  local_60 = 100;
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  local_58 = system("rm -rf  staleblktest* > errorlog.txt");
  fVar1 = fdb_open(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                   (fdb_config *)(ulong)in_stack_fffffffffffffe88);
  pFVar3 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar2 = fdb_error_msg(fVar1);
    fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x1b2);
    verify_high_num_keeping_headers_param_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x1b2,"void verify_high_num_keeping_headers_param_test()");
  }
  fVar1 = fdb_kvs_open(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18
                       ,in_stack_fffffffffffffe10);
  pFVar3 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar2 = fdb_error_msg(fVar1);
    fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x1b4);
    verify_high_num_keeping_headers_param_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x1b4,"void verify_high_num_keeping_headers_param_test()");
  }
  local_54 = 0;
  do {
    strlen("key");
    strlen("val");
    fVar1 = fdb_set_kv(in_stack_fffffffffffffca8,
                       (void *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                       in_stack_fffffffffffffc98,
                       (void *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                       (size_t)in_stack_fffffffffffffc88);
    pFVar3 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar2 = fdb_error_msg(fVar1);
      fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x1bd);
      verify_high_num_keeping_headers_param_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x1bd,"void verify_high_num_keeping_headers_param_test()");
    }
    local_54 = local_54 + 1;
    fVar1 = fdb_get_file_info((fdb_file_handle *)in_stack_fffffffffffffca8,
                              (fdb_file_info *)
                              CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
    pFVar3 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar2 = fdb_error_msg(fVar1);
      fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x1c0);
      verify_high_num_keeping_headers_param_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x1c0,"void verify_high_num_keeping_headers_param_test()");
    }
  } while (in_stack_fffffffffffffe28 < (fdb_file_handle *)0x1000001);
  fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffffc68,'\0');
  pFVar3 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar2 = fdb_error_msg(fVar1);
    fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x1c5);
    verify_high_num_keeping_headers_param_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x1c5,"void verify_high_num_keeping_headers_param_test()");
  }
  local_5c = local_54;
  for (local_54 = 0; (int)local_54 < local_60; local_54 = local_54 + 1) {
    sprintf(local_78,"key%d",(ulong)local_54);
    strlen(local_78);
    fVar1 = fdb_set_kv(in_stack_fffffffffffffca8,
                       (void *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                       in_stack_fffffffffffffc98,
                       (void *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                       (size_t)in_stack_fffffffffffffc88);
    pFVar3 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar2 = fdb_error_msg(fVar1);
      fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x1cc);
      verify_high_num_keeping_headers_param_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x1cc,"void verify_high_num_keeping_headers_param_test()");
    }
    fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffffc68,'\0');
    pFVar3 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar2 = fdb_error_msg(fVar1);
      fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x1ce);
      verify_high_num_keeping_headers_param_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x1ce,"void verify_high_num_keeping_headers_param_test()");
    }
  }
  local_54 = local_5c;
  while (local_54 = local_54 + -1, local_54 != 0) {
    strlen("key");
    strlen("val");
    fVar1 = fdb_set_kv(in_stack_fffffffffffffca8,
                       (void *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                       in_stack_fffffffffffffc98,
                       (void *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                       (size_t)in_stack_fffffffffffffc88);
    pFVar3 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar2 = fdb_error_msg(fVar1);
      fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x1d5);
      verify_high_num_keeping_headers_param_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x1d5,"void verify_high_num_keeping_headers_param_test()");
    }
  }
  fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffffc68,'\0');
  pFVar3 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar2 = fdb_error_msg(fVar1);
    fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x1d9);
    verify_high_num_keeping_headers_param_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x1d9,"void verify_high_num_keeping_headers_param_test()");
  }
  fVar1 = fdb_snapshot_open(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                            in_stack_ffffffffffffff10);
  if (fVar1 != FDB_RESULT_NO_DB_INSTANCE) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x1dd);
    verify_high_num_keeping_headers_param_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_NO_DB_INSTANCE) {
      __assert_fail("status == FDB_RESULT_NO_DB_INSTANCE",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x1dd,"void verify_high_num_keeping_headers_param_test()");
    }
  }
  local_5c = local_5c + 1;
  fVar1 = fdb_snapshot_open(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                            in_stack_ffffffffffffff10);
  pFVar3 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar2 = fdb_error_msg(fVar1);
    fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x1e2);
    verify_high_num_keeping_headers_param_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x1e2,"void verify_high_num_keeping_headers_param_test()");
  }
  strlen(local_78);
  fVar1 = fdb_get_kv(in_stack_fffffffffffffca8,
                     (void *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                     in_stack_fffffffffffffc98,
                     (void **)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                     in_stack_fffffffffffffc88);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pFVar3 = _stderr;
    pcVar2 = fdb_error_msg(fVar1);
    fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x1e5);
    verify_high_num_keeping_headers_param_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x1e5,"void verify_high_num_keeping_headers_param_test()");
  }
  fVar1 = fdb_free_block((void *)0x10793a);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fVar1 = fdb_kvs_close(in_stack_fffffffffffffc68);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pFVar3 = _stderr;
      pcVar2 = fdb_error_msg(fVar1);
      fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x1eb);
      verify_high_num_keeping_headers_param_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x1eb,"void verify_high_num_keeping_headers_param_test()");
    }
    fVar1 = fdb_close((fdb_file_handle *)in_stack_fffffffffffffc68);
    pFVar3 = _stderr;
    if (fVar1 == FDB_RESULT_SUCCESS) {
      fVar1 = fdb_shutdown();
      if (fVar1 == FDB_RESULT_SUCCESS) {
        memleak_end();
        if (verify_high_num_keeping_headers_param_test::__test_pass == 0) {
          fprintf(_stderr,"%s FAILED\n","verify high num keeping headers param test");
        }
        else {
          fprintf(_stderr,"%s PASSED\n","verify high num keeping headers param test");
        }
        return;
      }
      pFVar3 = _stderr;
      pcVar2 = fdb_error_msg(fVar1);
      fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x1ef);
      verify_high_num_keeping_headers_param_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x1ef,"void verify_high_num_keeping_headers_param_test()");
    }
    pcVar2 = fdb_error_msg(fVar1);
    fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x1ed);
    verify_high_num_keeping_headers_param_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x1ed,"void verify_high_num_keeping_headers_param_test()");
  }
  pFVar3 = _stderr;
  pcVar2 = fdb_error_msg(fVar1);
  fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
          ,0x1e9);
  verify_high_num_keeping_headers_param_test::__test_pass = 0;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x1e9,"void verify_high_num_keeping_headers_param_test()");
}

Assistant:

void verify_high_num_keeping_headers_param_test() {
    memleak_start();
    TEST_INIT();

    int i, r;
    int low_seq = 0;
    int nheaders=100;
    char keybuf[16];
    void *rvalue;
    size_t rvalue_len;

    fdb_file_handle* dbfile;
    fdb_kvs_handle* db;
    fdb_kvs_handle* snap_db;
    fdb_status status;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_file_info file_info;

    r = system(SHELL_DEL" staleblktest* > errorlog.txt");
    (void)r;

    // init
    fconfig.compaction_threshold = 0;
    fconfig.num_keeping_headers = nheaders;
    status = fdb_open(&dbfile, "./staleblktest1", &fconfig);
    TEST_STATUS(status);
    status = fdb_kvs_open(dbfile, &db, "num_keep", &kvs_config);
    TEST_STATUS(status);

    const char *key = "key";
    const char *val = "val";

    // load until exceeding SB_MIN_BLOCK_REUSING_FILESIZE
    i = 0;
    do {
        status = fdb_set_kv(db, key, strlen(key) + 1, val, strlen(val) + 1);
        TEST_STATUS(status);
        i++;
        status = fdb_get_file_info(dbfile, &file_info);
        TEST_STATUS(status);
    } while (file_info.file_size <= SB_MIN_BLOCK_REUSING_FILESIZE);

    // create lowest commit
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);
    low_seq = i;

    // create 100 headers
    for (i = 0; i < nheaders; ++i) {
        sprintf(keybuf, "key%d", i);
        status = fdb_set_kv(db, keybuf, strlen(keybuf), (char *)"reu", 4);
        TEST_STATUS(status);
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    // make sure all blocks up to kept headers are reused
    i = low_seq;
    while (--i) {
        status = fdb_set_kv(db, key, strlen(key) + 1, val, strlen(val) + 1);
        TEST_STATUS(status);
    }

    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // -101 commit fail
    status = fdb_snapshot_open(db, &snap_db, low_seq);
    TEST_CHK(status == FDB_RESULT_NO_DB_INSTANCE);

    // -100 commit pass
    low_seq++;
    status = fdb_snapshot_open(db, &snap_db, low_seq);
    TEST_STATUS(status);

    status = fdb_get_kv(db, keybuf, strlen(keybuf), &rvalue, &rvalue_len);
    TEST_STATUS(status);

    // cleanup
    status = fdb_free_block(rvalue);
    TEST_STATUS(status);
    status = fdb_kvs_close(snap_db);
    TEST_STATUS(status);
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    status = fdb_shutdown();
    TEST_STATUS(status);

    memleak_end();
    TEST_RESULT("verify high num keeping headers param test");
}